

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltimerquery.cpp
# Opt level: O2

void __thiscall QOpenGLTimeMonitorPrivate::recordSample(QOpenGLTimeMonitorPrivate *this)

{
  int iVar1;
  uint *puVar2;
  GLuint *pGVar3;
  _func_void_GLenum_GLuint *UNRECOVERED_JUMPTABLE;
  GLuint GVar4;
  GLenum GVar5;
  
  if (this->ext == (QExtTimerQueryHelper *)0x0) {
    puVar2 = (this->timers).d.ptr;
    iVar1 = this->currentSample;
    this->currentSample = iVar1 + 1;
    GVar5 = puVar2[(long)iVar1 + 1];
    UNRECOVERED_JUMPTABLE = (_func_void_GLenum_GLuint *)this->core->QueryCounter;
    GVar4 = 0x8e28;
LAB_0016c823:
    (*UNRECOVERED_JUMPTABLE)(GVar5,GVar4);
    return;
  }
  if ((long)this->currentSample == -1) {
    pGVar3 = (this->timers).d.ptr;
    this->currentSample = 0;
    (*this->core->BeginQuery)(0x88bf,*pGVar3);
    this->timerQueryActive = true;
  }
  else {
    if ((long)this->currentSample < (this->timers).d.size + -1) {
      (*this->core->EndQuery)(0x88bf);
      puVar2 = (this->timers).d.ptr;
      iVar1 = this->currentSample;
      this->currentSample = iVar1 + 1;
      GVar4 = puVar2[(long)iVar1 + 1];
      UNRECOVERED_JUMPTABLE = this->core->BeginQuery;
      GVar5 = 0x88bf;
      goto LAB_0016c823;
    }
    if (this->timerQueryActive == true) {
      (*this->core->EndQuery)(0x88bf);
      this->timerQueryActive = false;
    }
  }
  return;
}

Assistant:

void QOpenGLTimeMonitorPrivate::recordSample()
{
    // Use glQueryCounter() and GL_TIMESTAMP where available.
    // Otherwise, simulate it with glBeginQuery()/glEndQuery()
    if (!ext) {
#if defined(GL_TIMESTAMP)
        core->glQueryCounter(timers.at(++currentSample), GL_TIMESTAMP);
#endif
    } else {
        if (currentSample == -1) {
            core->glBeginQuery(GL_TIME_ELAPSED_EXT, timers.at(++currentSample));
            timerQueryActive = true;
        } else if (currentSample < timers.size() - 1) {
            core->glEndQuery(GL_TIME_ELAPSED_EXT);
            core->glBeginQuery(GL_TIME_ELAPSED_EXT, timers.at(++currentSample));
        } else {
            if (timerQueryActive) {
                core->glEndQuery(GL_TIME_ELAPSED_EXT);
                timerQueryActive = false;
            }
        }
    }
}